

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

message_t * message_get(uint16_t age)

{
  message_t *pmVar1;
  msgqueue_t *pmVar2;
  bool bVar3;
  
  pmVar2 = messages;
  while( true ) {
    pmVar1 = pmVar2->head;
    bVar3 = age == 0;
    age = age - 1;
    if ((pmVar1 == (message_t *)0x0) || (bVar3)) break;
    pmVar2 = (msgqueue_t *)&pmVar1->older;
  }
  return pmVar1;
}

Assistant:

static message_t *message_get(uint16_t age)
{
	message_t *m = messages->head;

	while (m && age) {
		age--;
		m = m->older;
	}

	return m;
}